

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

MidiMessage * __thiscall smf::MidiMessage::getMetaContent_abi_cxx11_(MidiMessage *this)

{
  bool bVar1;
  byte *pbVar2;
  size_type sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  undefined4 local_38;
  int i;
  undefined4 local_24;
  int start;
  MidiMessage *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)this);
  bVar1 = isMetaMessage((MidiMessage *)in_RSI);
  if (bVar1) {
    local_24 = 3;
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,2);
    if (0x7f < *pbVar2) {
      local_24 = 4;
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,3);
      if (0x7f < *pbVar2) {
        local_24 = 5;
        pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,4);
        if (0x7f < *pbVar2) {
          local_24 = 6;
          pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,5);
          if (0x7f < *pbVar2) {
            local_24 = 7;
          }
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
    std::__cxx11::string::reserve((ulong)this);
    for (local_38 = local_24;
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI),
        local_38 < (int)sVar3; local_38 = local_38 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,(long)local_38);
      std::__cxx11::string::push_back((char)this);
    }
  }
  return this;
}

Assistant:

std::string MidiMessage::getMetaContent(void) {
	std::string output;
	if (!isMetaMessage()) {
		return output;
	}
	int start = 3;
	if (operator[](2) > 0x7f) {
		start++;
		if (operator[](3) > 0x7f) {
			start++;
			if (operator[](4) > 0x7f) {
				start++;
				if (operator[](5) > 0x7f) {
					start++;
					// maximum of 5 bytes in VLV, so last must be < 0x80
				}
			}
		}
	}
	output.reserve(this->size());
	for (int i=start; i<(int)this->size(); i++) {
		output.push_back(operator[](i));
	}
	return output;
}